

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  uint uVar1;
  uint __val;
  long lVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __len;
  stringstream out;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_1f8,this,opt,1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,local_1f0);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if (opt->expected_ < 2) {
    if (opt->expected_ < 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"...",3);
    }
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
    uVar1 = opt->expected_;
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_0010de84;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_0010de84;
        }
        if (uVar6 < 10000) goto LAB_0010de84;
        uVar9 = uVar9 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_0010de84:
    local_1f8 = &local_1e8;
    ::std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)__len - (char)((int)uVar1 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_1f8 + (ulong)(uVar1 >> 0x1f)),__len,__val);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_1f8,local_1f0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"x)",2);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
  }
  if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
    ::std::__cxx11::stringbuf::str();
  }
  else {
    ::std::__cxx11::stringbuf::str();
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x136a12);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_1e8 = *plVar7;
      lStack_1e0 = plVar5[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar7;
      local_1f8 = (long *)*plVar5;
    }
    local_1f0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);

    if(opt->get_expected() > 1)
        out << "(" << std::to_string(opt->get_expected()) << "x)";
    else if(opt->get_expected() < 0)
        out << "...";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}